

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void insert(upb_table *t,lookupkey_t key,upb_tabkey tabkey,upb_value val,uint32_t hash,
           hashfunc_t *hashfunc,eqlfunc_t *eql)

{
  _Bool _Var1;
  uint32_t hash_00;
  upb_tabent *puVar2;
  upb_tabent *local_58;
  upb_tabent *chain;
  upb_tabent *new_e;
  upb_tabent *our_e;
  upb_tabent *mainpos_e;
  uint32_t hash_local;
  upb_tabkey tabkey_local;
  upb_table *t_local;
  upb_value val_local;
  lookupkey_t key_local;
  
  puVar2 = findentry(t,key,hash,eql);
  if (puVar2 != (upb_tabent *)0x0) {
    __assert_fail("findentry(t, key, hash, eql) == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/hash/common.c"
                  ,0xa2,
                  "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  t->count = t->count + 1;
  new_e = getentry_mutable(t,hash);
  _Var1 = upb_tabent_isempty(new_e);
  if (_Var1) {
    new_e->next = (_upb_tabent *)0x0;
  }
  else {
    puVar2 = emptyent(t,new_e);
    hash_00 = (*hashfunc)(new_e->key);
    local_58 = getentry_mutable(t,hash_00);
    if (local_58 == new_e) {
      puVar2->next = new_e->next;
      new_e->next = puVar2;
      new_e = puVar2;
    }
    else {
      puVar2->key = new_e->key;
      (puVar2->val).val = (new_e->val).val;
      puVar2->next = new_e->next;
      while (local_58->next != new_e) {
        local_58 = local_58->next;
        if (local_58 == (_upb_tabent *)0x0) {
          __assert_fail("chain",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/hash/common.c"
                        ,0xbe,
                        "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                       );
        }
      }
      local_58->next = puVar2;
      new_e->next = (_upb_tabent *)0x0;
    }
  }
  new_e->key = tabkey;
  (new_e->val).val = val.val;
  puVar2 = findentry(t,key,hash,eql);
  if (puVar2 != new_e) {
    __assert_fail("findentry(t, key, hash, eql) == our_e",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/hash/common.c"
                  ,199,
                  "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  return;
}

Assistant:

static void insert(upb_table* t, lookupkey_t key, upb_tabkey tabkey,
                   upb_value val, uint32_t hash, hashfunc_t* hashfunc,
                   eqlfunc_t* eql) {
  upb_tabent* mainpos_e;
  upb_tabent* our_e;

  UPB_ASSERT(findentry(t, key, hash, eql) == NULL);

  t->count++;
  mainpos_e = getentry_mutable(t, hash);
  our_e = mainpos_e;

  if (upb_tabent_isempty(mainpos_e)) {
    /* Our main position is empty; use it. */
    our_e->next = NULL;
  } else {
    /* Collision. */
    upb_tabent* new_e = emptyent(t, mainpos_e);
    /* Head of collider's chain. */
    upb_tabent* chain = getentry_mutable(t, hashfunc(mainpos_e->key));
    if (chain == mainpos_e) {
      /* Existing ent is in its main position (it has the same hash as us, and
       * is the head of our chain).  Insert to new ent and append to this chain.
       */
      new_e->next = mainpos_e->next;
      mainpos_e->next = new_e;
      our_e = new_e;
    } else {
      /* Existing ent is not in its main position (it is a node in some other
       * chain).  This implies that no existing ent in the table has our hash.
       * Evict it (updating its chain) and use its ent for head of our chain. */
      *new_e = *mainpos_e; /* copies next. */
      while (chain->next != mainpos_e) {
        chain = (upb_tabent*)chain->next;
        UPB_ASSERT(chain);
      }
      chain->next = new_e;
      our_e = mainpos_e;
      our_e->next = NULL;
    }
  }
  our_e->key = tabkey;
  our_e->val.val = val.val;
  UPB_ASSERT(findentry(t, key, hash, eql) == our_e);
}